

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_agent_forward_ok.c
# Opt level: O1

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  
  pcVar3 = (char *)libssh2_userauth_list(session,"libssh2",7);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "libssh2_userauth_list";
  }
  else {
    pcVar4 = strstr(pcVar3,"publickey");
    if (pcVar4 == (char *)0x0) {
      fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",pcVar3);
      return 1;
    }
    pcVar3 = srcdir_path("key_rsa.pub");
    pcVar4 = srcdir_path("key_rsa");
    iVar1 = libssh2_userauth_publickey_fromfile_ex(session,"libssh2",7,pcVar3,pcVar4,0);
    if (iVar1 == 0) {
      uVar5 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,0);
      uVar2 = libssh2_channel_request_auth_agent(uVar5);
      if (uVar2 != 0) {
        fprintf(_stderr,"Auth agent request for agent forwarding failed, error code %d\n",
                (ulong)uVar2);
        return 1;
      }
      return 0;
    }
    pcVar3 = "libssh2_userauth_publickey_fromfile_ex";
  }
  print_last_session_error(pcVar3);
  return 1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    int rc;
    LIBSSH2_CHANNEL *channel;

    const char *userauth_list =
        libssh2_userauth_list(session, username,
                              (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                srcdir_path(key_file_public),
                                                srcdir_path(key_file_private),
                                                NULL);
    if(rc) {
        print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
        return 1;
    }

    channel = libssh2_channel_open_session(session);
    #if 0
    if(!channel) {
        printf("Error opening channel\n");
        return 1;
    }
    #endif

    rc = libssh2_channel_request_auth_agent(channel);
    if(rc) {
        fprintf(stderr, "Auth agent request for agent forwarding failed, "
            "error code %d\n", rc);
        return 1;
    }

    return 0;
}